

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# makemon.c
# Opt level: O2

permonst * rndmonst(level *lev)

{
  d_level *dlev;
  char cVar1;
  ushort uVar2;
  mon_gen_override *pmVar3;
  mon_gen_tuple *pmVar4;
  boolean bVar5;
  boolean bVar6;
  byte bVar7;
  short sVar8;
  uint uVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  ushort **ppuVar13;
  s_level *psVar14;
  d_flags *pdVar15;
  mon_gen_tuple **ppmVar16;
  permonst *ppVar17;
  ulong uVar18;
  bool bVar19;
  
  dlev = &lev->z;
  if (lev->mon_gen != (mon_gen_override *)0x0) {
    uVar9 = mt_random();
    pmVar3 = lev->mon_gen;
    if ((int)(uVar9 % 100) < pmVar3->override_chance) {
      iVar10 = rnd(pmVar3->total_mon_freq);
      ppmVar16 = &pmVar3->gen_chances;
      uVar9 = 100;
LAB_001b588d:
      do {
        pmVar4 = *ppmVar16;
        if (pmVar4 != (mon_gen_tuple *)0x0) {
          iVar11 = iVar10 - pmVar4->freq;
          if (iVar11 != 0 && pmVar4->freq <= iVar10) {
            ppmVar16 = &pmVar4->next;
            iVar10 = iVar11;
            goto LAB_001b588d;
          }
          iVar12 = pmVar4->monid;
          if (pmVar4->is_sym != '\0') {
            ppVar17 = mkclass(dlev,(char)iVar12,0);
            if (ppVar17 != (permonst *)0x0) {
              return ppVar17;
            }
            break;
          }
          iVar10 = iVar11;
          if ((mvitals[iVar12].mvflags & 2) == 0) {
            return mons + iVar12;
          }
        }
        bVar19 = 1 < uVar9;
        ppmVar16 = &pmVar3->gen_chances;
        uVar9 = uVar9 - 1;
      } while (bVar19);
    }
  }
  if (rndmonst_state.choice_count < 0) {
    rndmonst_state.choice_count = 0;
    ppVar17 = mons;
    for (uVar18 = 0; uVar18 != 0x158; uVar18 = uVar18 + 1) {
      bVar5 = uncommon(dlev,(int)uVar18);
      if (bVar5 == '\0') {
        iVar10 = min_monster_difficulty(dlev);
        iVar11 = max_monster_difficulty(dlev);
        bVar5 = on_level(dlev,&dungeon_topology.d_rogue_level);
        bVar19 = true;
        if (dlev->dnum == dungeon_topology.d_astral_level.dnum) {
          bVar6 = on_level(dlev,&dungeon_topology.d_astral_level);
          bVar19 = bVar6 != '\0';
        }
        goto LAB_001b5993;
      }
      rndmonst_state.mchoices[uVar18] = '\0';
      ppVar17 = ppVar17 + 1;
    }
  }
  else {
LAB_001b5bcb:
    if (0 < rndmonst_state.choice_count) {
      iVar10 = rnd(rndmonst_state.choice_count);
      ppVar17 = mons;
      for (uVar18 = 0; uVar18 != 0x158; uVar18 = uVar18 + 1) {
        iVar11 = iVar10 - rndmonst_state.mchoices[uVar18];
        if (iVar11 == 0 || iVar10 < rndmonst_state.mchoices[uVar18]) {
          bVar5 = uncommon(dlev,(int)uVar18);
          if (bVar5 == '\0') {
            return ppVar17;
          }
          goto LAB_001b5c1d;
        }
        ppVar17 = ppVar17 + 1;
        iVar10 = iVar11;
      }
      uVar18 = 0x158;
LAB_001b5c1d:
      warning("rndmonst: bad `mndx\' [#%d]",uVar18 & 0xffffffff);
    }
  }
  return (permonst *)0x0;
LAB_001b5993:
  if (uVar18 == 0x158) goto LAB_001b5bcb;
  rndmonst_state.mchoices[uVar18] = '\0';
  if (((iVar10 <= monstr[uVar18]) && (monstr[uVar18] <= iVar11)) &&
     ((bVar5 == '\0' ||
      (ppuVar13 = __ctype_b_loc(),
      (*(byte *)((long)*ppuVar13 + (ulong)(byte)""[ppVar17->mlet] * 2 + 1) & 1) != 0)))) {
    if (!bVar19) {
      cVar1 = ppVar17->mlet;
      if (cVar1 == '\x1f') {
        bVar7 = is_home_elemental(dlev,ppVar17);
      }
      else {
        bVar6 = on_level(dlev,&dungeon_topology.d_earth_level);
        if (bVar6 != '\0') goto LAB_001b5a25;
        bVar6 = on_level(dlev,&dungeon_topology.d_water_level);
        if (bVar6 == '\0') {
          bVar6 = on_level(dlev,&dungeon_topology.d_fire_level);
          if (bVar6 == '\0') {
            bVar6 = on_level(dlev,&dungeon_topology.d_air_level);
            if (bVar6 != '\0') {
              if ((ppVar17->mflags1 & 1) == 0) {
                if (cVar1 != '\x05') {
LAB_001b5b94:
                  if (((cVar1 != '6' && (char)((ppVar17->mflags1 & 4) >> 2) == '\0') &&
                      (uVar18 != 0x9f)) && (cVar1 != '\x16')) goto LAB_001b5b36;
                }
              }
              else if (cVar1 == '\x14') goto LAB_001b5b94;
            }
            goto LAB_001b5a25;
          }
          bVar7 = ppVar17->mresists & 1;
        }
        else {
          bVar7 = (byte)ppVar17->mflags1 & 2;
        }
      }
      if (bVar7 == 0) goto LAB_001b5b36;
    }
LAB_001b5a25:
    bVar6 = uncommon(dlev,(int)uVar18);
    if (((bVar6 == '\0') &&
        ((bVar6 = In_hell(dlev), bVar6 == '\0' || ((ppVar17->geno & 0x800) == 0)))) &&
       (((ppVar17->mflags2 & 0x400000) == 0 ||
        (bVar6 = on_level(dlev,&dungeon_topology.d_blackmarket_level), bVar6 == '\0')))) {
      uVar2 = ppVar17->geno;
      psVar14 = Is_special(dlev);
      if (psVar14 == (s_level *)0x0) {
        pdVar15 = &dungeons[dlev->dnum].flags;
      }
      else {
        pdVar15 = &psVar14->flags;
      }
      uVar9 = (uint)*pdVar15 >> 4 & 7;
      if (uVar9 == 1) {
        sVar8 = -(short)ppVar17->maligntyp;
LAB_001b5b03:
        iVar12 = (int)((short)(sVar8 + 0x14) / 8);
      }
      else if (uVar9 == 2) {
        bVar7 = ppVar17->maligntyp >> 7;
        iVar12 = (int)((char)((bVar7 - (ppVar17->maligntyp ^ bVar7)) + '\x14') / '\x04');
      }
      else {
        iVar12 = 0;
        if (uVar9 == 4) {
          sVar8 = (short)ppVar17->maligntyp;
          goto LAB_001b5b03;
        }
      }
      uVar9 = (uVar2 & 7) + iVar12;
      if ((int)uVar9 < 0) {
        panic("rndmonst: bad count [#%d: %d]",uVar18 & 0xffffffff,(ulong)uVar9);
      }
      rndmonst_state.choice_count = rndmonst_state.choice_count + uVar9;
      rndmonst_state.mchoices[uVar18] = (char)uVar9;
    }
  }
LAB_001b5b36:
  uVar18 = uVar18 + 1;
  ppVar17 = ppVar17 + 1;
  goto LAB_001b5993;
}

Assistant:

const struct permonst *rndmonst(struct level *lev)
{
	const struct permonst *ptr;
	int mndx, ct;
	const d_level *dlev = &lev->z;

	if (lev->mon_gen &&
	    rn2(100) < lev->mon_gen->override_chance &&
	    (ptr = get_override_mon(&lev->z, lev->mon_gen)) != NULL)
	    return ptr;

	if (rndmonst_state.choice_count < 0) {	/* need to recalculate */
	    int minmlev, maxmlev;
	    boolean elemlevel;
	    boolean upper;

	    rndmonst_state.choice_count = 0;
	    /* look for first common monster */
	    for (mndx = LOW_PM; mndx < SPECIAL_PM; mndx++) {
		if (!uncommon(dlev, mndx)) break;
		rndmonst_state.mchoices[mndx] = 0;
	    }		
	    if (mndx == SPECIAL_PM) {
		/* evidently they've all been exterminated */
		return NULL;
	    } /* else `mndx' now ready for use below */
	    minmlev = min_monster_difficulty(dlev);
	    maxmlev = max_monster_difficulty(dlev);
	    upper = Is_rogue_level(dlev);
	    elemlevel = In_endgame(dlev) && !Is_astralevel(dlev);

/*
 *	Find out how many monsters exist in the range we have selected.
 */
	    /* (`mndx' initialized above) */
	    for ( ; mndx < SPECIAL_PM; mndx++) {
		ptr = &mons[mndx];
		rndmonst_state.mchoices[mndx] = 0;
		if (tooweak(mndx, minmlev) || toostrong(mndx, maxmlev))
		    continue;
		if (upper && !isupper((uchar)def_monsyms[(int)(ptr->mlet)])) continue;
		if (elemlevel && wrong_elem_type(dlev, ptr)) continue;
		if (uncommon(dlev, mndx)) continue;
		if (In_hell(dlev) && (ptr->geno & G_NOHELL)) continue;
		/* SWD: pets are not allowed in the black market */
		if (is_domestic(ptr) && Is_blackmarket(dlev)) continue;
		ct = (int)(ptr->geno & G_FREQ) + align_shift(dlev, ptr);
		if (ct < 0 || ct > 127)
		    panic("rndmonst: bad count [#%d: %d]", mndx, ct);
		rndmonst_state.choice_count += ct;
		rndmonst_state.mchoices[mndx] = (char)ct;
	    }
/*
 *	    Possible modification:  if choice_count is "too low",
 *	    expand minmlev..maxmlev range and try again.
 */
	} /* choice_count+mchoices[] recalc */

	if (rndmonst_state.choice_count <= 0) {
	    /* maybe no common mons left, or all are too weak or too strong */
	    return NULL;
	}

/*
 *	Now, select a monster at random.
 */
	ct = rnd(rndmonst_state.choice_count);
	for (mndx = LOW_PM; mndx < SPECIAL_PM; mndx++)
	    if ((ct -= (int)rndmonst_state.mchoices[mndx]) <= 0) break;

	if (mndx == SPECIAL_PM || uncommon(dlev, mndx)) {	/* shouldn't happen */
	    warning("rndmonst: bad `mndx' [#%d]", mndx);
	    return NULL;
	}
	return &mons[mndx];
}